

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_to_compressed_c.cpp
# Opt level: O1

stb_uint stb_compress(stb_uchar *out,stb_uchar *input,stb_uint length)

{
  stb_uchar *psVar1;
  stb_uint sVar2;
  void *__s;
  byte *pbVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  byte *pbVar22;
  ulong uVar23;
  int iVar24;
  byte *pbVar25;
  byte *pbVar26;
  int iVar27;
  byte *local_70;
  
  stb__out = out;
  __s = malloc(0x40000);
  if (__s != (void *)0x0) {
    memset(__s,0,0x40000);
    if (out == (stb_uchar *)0x0) {
      fputc(0x57,(FILE *)0x0);
      stb__outbytes = stb__outbytes + 1;
    }
    else {
      stb__out = out + 1;
      *out = 'W';
    }
    if (stb__out == (stb_uchar *)0x0) {
      fputc(0xbc,(FILE *)0x0);
      stb__outbytes = stb__outbytes + 1;
    }
    else {
      psVar1 = stb__out + 1;
      *stb__out = 0xbc;
      stb__out = psVar1;
    }
    stb_out2(0);
    stb_out4(0);
    stb_out4(length);
    stb_out4(0x40000);
    stb__running_adler = 1;
    pbVar22 = input + length;
    pbVar26 = input;
    local_70 = input;
    if (0xc < (int)length) {
      pbVar3 = input + 0xc;
      pbVar25 = input;
      do {
        iVar24 = (int)pbVar25;
        uVar12 = (int)pbVar22 - iVar24;
        if (pbVar25 + 0x10000 <= pbVar22) {
          uVar12 = 0x10000;
        }
        uVar5 = (ulong)uVar12;
        uVar12 = (uint)pbVar25[2] + (uint)pbVar25[1] * 0x80 + (uint)*pbVar25 * 0x4000;
        uVar6 = (ulong)((uVar12 >> 0x10) + uVar12 & 0x7fff);
        lVar8 = *(long *)((long)__s + uVar6 * 8);
        uVar23 = 2;
        iVar27 = 0;
        if (lVar8 != 0) {
          uVar7 = 0;
          if (uVar5 != 0) {
            uVar17 = 0;
            do {
              uVar7 = uVar17;
              if (*(byte *)(lVar8 + uVar17) != pbVar25[uVar17]) break;
              uVar17 = uVar17 + 1;
              uVar7 = uVar5;
            } while (uVar5 != uVar17);
          }
          iVar16 = (int)uVar7;
          if (((2 < iVar16) && ((long)pbVar25 - lVar8 < 0x40001)) &&
             ((((iVar18 = (int)((long)pbVar25 - lVar8), 9 < iVar16 || (iVar18 < 0x101)) ||
               ((iVar18 < 0x4001 && (5 < iVar16)))) ||
              ((iVar27 = 0, iVar18 < 0x80001 && (7 < iVar16)))))) {
            uVar23 = uVar7 & 0xffffffff;
            iVar27 = iVar18;
          }
        }
        uVar12 = (uint)pbVar25[4] + (uint)pbVar25[3] * 0x80 + (uVar12 * 0x4000 | uVar12 >> 0x12);
        uVar7 = (ulong)((uVar12 >> 0x10) + uVar12 & 0x7fff);
        lVar8 = *(long *)((long)__s + uVar7 * 8);
        if ((lVar8 != 0) && (lVar21 = (long)pbVar25 - lVar8, lVar21 != iVar27)) {
          if (uVar5 == 0) {
            uVar20 = 0;
          }
          else {
            uVar17 = 0;
            do {
              uVar4 = uVar17;
              if (*(byte *)(lVar8 + uVar17) != pbVar25[uVar17]) break;
              uVar17 = uVar17 + 1;
              uVar4 = uVar5;
            } while (uVar5 != uVar17);
            uVar20 = (uint)uVar4;
          }
          if (((lVar21 < 0x40001) && ((int)uVar23 < (int)uVar20)) &&
             (((iVar16 = (int)lVar21, 9 < (int)uVar20 || (iVar16 < 0x101)) ||
              (((iVar16 < 0x4001 && (5 < (int)uVar20)) || ((iVar16 < 0x80001 && (7 < (int)uVar20))))
              )))) {
            uVar23 = (ulong)uVar20;
            iVar27 = iVar16;
          }
        }
        uVar12 = (uint)pbVar25[5] * 0x80 + (uint)pbVar25[6] + (uVar12 * 0x4000 | uVar12 >> 0x12);
        uVar12 = (uint)pbVar25[8] + (uVar12 * 0x4000 | uVar12 >> 0x12) + (uint)pbVar25[7] * 0x80;
        uVar17 = (ulong)((uVar12 >> 0x10) + uVar12 & 0x7fff);
        lVar8 = *(long *)((long)__s + uVar17 * 8);
        if ((lVar8 != 0) && (lVar21 = (long)pbVar25 - lVar8, lVar21 != iVar27)) {
          uVar4 = 0;
          uVar20 = 0;
          if (uVar5 != 0) {
            do {
              uVar11 = uVar4;
              if (*(byte *)(lVar8 + uVar4) != pbVar25[uVar4]) break;
              uVar4 = uVar4 + 1;
              uVar11 = uVar5;
            } while (uVar5 != uVar4);
            uVar20 = (uint)uVar11;
          }
          if (((lVar21 < 0x40001) && ((int)uVar23 < (int)uVar20)) &&
             (((iVar16 = (int)lVar21, 9 < (int)uVar20 || (iVar16 < 0x101)) ||
              (((iVar16 < 0x4001 && (5 < (int)uVar20)) || ((iVar16 < 0x80001 && (7 < (int)uVar20))))
              )))) {
            uVar23 = (ulong)uVar20;
            iVar27 = iVar16;
          }
        }
        uVar12 = (uint)pbVar25[9] * 0x80 + (uint)pbVar25[10] + (uVar12 * 0x4000 | uVar12 >> 0x12);
        uVar12 = (uint)*pbVar3 + (uVar12 * 0x4000 | uVar12 >> 0x12) + (uint)pbVar25[0xb] * 0x80;
        uVar4 = (ulong)((uVar12 >> 0x10) + uVar12 & 0x7fff);
        lVar8 = *(long *)((long)__s + uVar4 * 8);
        if ((lVar8 != 0) && (lVar21 = (long)pbVar25 - lVar8, lVar21 != iVar27)) {
          uVar19 = 0;
          uVar11 = uVar19;
          if (uVar5 != 0) {
            do {
              uVar11 = uVar19;
              if (*(byte *)(lVar8 + uVar19) != pbVar25[uVar19]) break;
              uVar19 = uVar19 + 1;
              uVar11 = uVar5;
            } while (uVar5 != uVar19);
          }
          if (((lVar21 < 0x40001) && (iVar16 = (int)uVar11, (int)uVar23 < iVar16)) &&
             ((((iVar18 = (int)lVar21, 9 < iVar16 || (iVar18 < 0x101)) ||
               ((iVar18 < 0x4001 && (5 < iVar16)))) || ((iVar18 < 0x80001 && (7 < iVar16)))))) {
            uVar23 = uVar11 & 0xffffffff;
            iVar27 = iVar18;
          }
        }
        *(byte **)((long)__s + uVar4 * 8) = pbVar25;
        *(byte **)((long)__s + uVar17 * 8) = pbVar25;
        *(byte **)((long)__s + uVar7 * 8) = pbVar25;
        *(byte **)((long)__s + uVar6 * 8) = pbVar25;
        iVar16 = (int)uVar23;
        if ((2 < iVar16) && (iVar27 < 1)) {
          __assert_fail("dist > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/misc/fonts/binary_to_compressed_c.cpp"
                        ,0x125,
                        "int stb_compress_chunk(stb_uchar *, stb_uchar *, stb_uchar *, int, int *, stb_uchar **, stb_uint)"
                       );
        }
        pbVar26 = pbVar25 + 1;
        if (2 < iVar16) {
          iVar18 = (int)local_70;
          if ((iVar16 < 0x81) && (iVar27 < 0x101)) {
            outliterals(local_70,iVar24 - iVar18);
            if (stb__out == (stb_uchar *)0x0) {
              fputc(iVar16 + 0x7fU & 0xff,(FILE *)0x0);
              stb__outbytes = stb__outbytes + 1;
            }
            else {
              psVar1 = stb__out + 1;
              *stb__out = (char)uVar23 + '\x7f';
              stb__out = psVar1;
            }
            if (stb__out == (stb_uchar *)0x0) {
              fputc(iVar27 - 1U & 0xff,(FILE *)0x0);
              stb__outbytes = stb__outbytes + 1;
            }
            else {
              psVar1 = stb__out + 1;
              *stb__out = (char)iVar27 + 0xff;
              stb__out = psVar1;
            }
LAB_00101cfb:
            pbVar26 = pbVar25 + uVar23;
            local_70 = pbVar26;
          }
          else {
            if ((iVar16 - 6U < 0xfb) && (iVar27 < 0x4001)) {
              outliterals(local_70,iVar24 - iVar18);
              stb_out2(iVar27 + 0x3fff);
            }
            else {
              if ((0xf8 < iVar16 - 8U) || (0x80000 < iVar27)) {
                if ((0xfff7 < iVar16 - 9U) || (0x80000 < iVar27)) {
                  if ((9 < iVar16) && (iVar27 < 0x1000001)) {
                    uVar6 = 0x10000;
                    if (iVar16 < 0x10000) {
                      uVar6 = uVar23;
                    }
                    outliterals(local_70,iVar24 - iVar18);
                    pbVar26 = pbVar25 + uVar6;
                    local_70 = pbVar26;
                    if (iVar16 < 0x101) {
                      if (stb__out == (stb_uchar *)0x0) {
                        fputc(6,(FILE *)0x0);
                        stb__outbytes = stb__outbytes + 1;
                      }
                      else {
                        psVar1 = stb__out + 1;
                        *stb__out = '\x06';
                        stb__out = psVar1;
                      }
                      stb_out3(iVar27 - 1);
                      if (stb__out == (stb_uchar *)0x0) {
                        fputc((int)uVar6 - 1U & 0xff,(FILE *)0x0);
                        stb__outbytes = stb__outbytes + 1;
                      }
                      else {
                        psVar1 = stb__out + 1;
                        *stb__out = (char)uVar6 + 0xff;
                        stb__out = psVar1;
                      }
                    }
                    else {
                      if (stb__out == (stb_uchar *)0x0) {
                        fputc(4,(FILE *)0x0);
                        stb__outbytes = stb__outbytes + 1;
                      }
                      else {
                        psVar1 = stb__out + 1;
                        *stb__out = '\x04';
                        stb__out = psVar1;
                      }
                      stb_out3(iVar27 - 1);
                      stb_out2((int)uVar6 - 1);
                    }
                  }
                  goto LAB_00101d05;
                }
                outliterals(local_70,iVar24 - iVar18);
                stb_out3(iVar27 + 0xfffff);
                stb_out2(iVar16 - 1);
                goto LAB_00101cfb;
              }
              outliterals(local_70,iVar24 - iVar18);
              stb_out3(iVar27 + 0x17ffff);
            }
            pbVar26 = pbVar25 + uVar23;
            local_70 = pbVar26;
            if (stb__out == (stb_uchar *)0x0) {
              fputc(iVar16 - 1U & 0xff,(FILE *)0x0);
              stb__outbytes = stb__outbytes + 1;
            }
            else {
              psVar1 = stb__out + 1;
              *stb__out = (char)uVar23 + 0xff;
              stb__out = psVar1;
            }
          }
        }
LAB_00101d05:
      } while ((pbVar26 < input + (int)length) &&
              (pbVar3 = pbVar26 + 0xc, pbVar25 = pbVar26, pbVar3 < pbVar22));
    }
    pbVar3 = input + (int)length;
    if ((long)(int)length <= (long)pbVar26 - (long)input) {
      pbVar3 = pbVar26;
    }
    uVar5 = (ulong)(stb__running_adler & 0xffff);
    uVar6 = (ulong)(stb__running_adler >> 0x10);
    uVar12 = (int)pbVar3 - (int)input;
    if (uVar12 != 0) {
      uVar23 = (ulong)(uVar12 % 0x15b0);
      uVar20 = uVar12;
      do {
        uVar7 = 0;
        uVar17 = uVar7;
        if (7 < uVar23) {
          do {
            lVar8 = input[uVar17] + uVar5;
            lVar13 = (ulong)input[uVar17 + 1] + lVar8;
            lVar21 = (ulong)input[uVar17 + 2] + lVar13;
            lVar14 = (ulong)input[uVar17 + 3] + lVar21;
            lVar9 = (ulong)input[uVar17 + 4] + lVar14;
            lVar15 = (ulong)input[uVar17 + 5] + lVar9;
            lVar10 = (ulong)input[uVar17 + 6] + lVar15;
            uVar5 = (ulong)input[uVar17 + 7] + lVar10;
            uVar6 = uVar6 + lVar8 + lVar13 + lVar21 + lVar14 + lVar9 + lVar15 + lVar10 + uVar5;
            uVar7 = uVar17 + 8;
            uVar4 = uVar17 + 0xf;
            uVar17 = uVar7;
          } while (uVar4 < uVar23);
          input = input + uVar7;
        }
        lVar8 = uVar23 - uVar7;
        if (uVar7 <= uVar23 && lVar8 != 0) {
          lVar21 = 0;
          do {
            uVar5 = uVar5 + input[lVar21];
            uVar6 = uVar6 + uVar5;
            lVar21 = lVar21 + 1;
          } while (lVar8 != lVar21);
          input = input + lVar8;
        }
        uVar5 = uVar5 % 0xfff1;
        uVar6 = uVar6 % 0xfff1;
        uVar20 = uVar20 - (int)uVar23;
        uVar23 = 0x15b0;
      } while (uVar20 != 0);
    }
    stb__running_adler = (int)uVar5 + (int)uVar6 * 0x10000;
    if (uVar12 != length) {
      __assert_fail("len == length",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/misc/fonts/binary_to_compressed_c.cpp"
                    ,0x16c,"int stb_compress_inner(stb_uchar *, stb_uint)");
    }
    iVar24 = (int)pbVar3 - (int)local_70;
    outliterals(pbVar22 + -(long)iVar24,iVar24);
    free(__s);
    stb_out2(0x5fa);
    stb_out4(stb__running_adler);
  }
  sVar2 = (int)stb__out - (int)out;
  return sVar2;
}

Assistant:

stb_uint stb_compress(stb_uchar *out, stb_uchar *input, stb_uint length)
{
    stb__out = out;
    stb__outfile = NULL;

    stb_compress_inner(input, length);

    return stb__out - out;
}